

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayValue.cpp
# Opt level: O0

Value * __thiscall ArrayValue::AtIndex(ArrayValue *this,size_t index)

{
  size_type sVar1;
  runtime_error *this_00;
  reference ppVVar2;
  size_t index_local;
  ArrayValue *this_local;
  
  sVar1 = std::vector<Value_*,_std::allocator<Value_*>_>::size(&this->buffer_);
  if (sVar1 <= index) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Index out of bounds");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVVar2 = std::vector<Value_*,_std::allocator<Value_*>_>::operator[](&this->buffer_,index);
  return *ppVVar2;
}

Assistant:

Value* ArrayValue::AtIndex(size_t index) {
  if (index >= buffer_.size()) {
    throw std::runtime_error("Index out of bounds");
  } else {
    return buffer_[index];
  }
}